

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleSizeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  unsigned_long __val;
  string_view value;
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    bVar2 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar2) {
      this = status->Makefile;
      __val = cmsys::SystemTools::FileLength(pbVar1 + 1);
      std::__cxx11::to_string((string *)&local_78,__val);
      value._M_str = (char *)local_78.View_._M_len;
      value._M_len = (size_t)local_78.View_._M_str;
      cmMakefile::AddDefinition(this,pbVar1 + 2,value);
      std::__cxx11::string::~string((string *)&local_78);
      return true;
    }
    local_78.View_._M_len = 0x2f;
    local_78.View_._M_str = "SIZE requested of path that is not readable:\n  ";
    local_48.View_._M_str = pbVar1[1]._M_dataplus._M_p;
    local_48.View_._M_len = pbVar1[1]._M_string_length;
    cmStrCat<>(&sStack_98,&local_78,&local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_78.View_._M_str = (pbVar1->_M_dataplus)._M_p;
    local_78.View_._M_len = pbVar1->_M_string_length;
    local_48.View_._M_len = 0x29;
    local_48.View_._M_str = " requires a file name and output variable";
    cmStrCat<>(&sStack_98,&local_78,&local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&sStack_98);
  return false;
}

Assistant:

bool HandleSizeCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    status.SetError(
      cmStrCat("SIZE requested of path that is not readable:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(
    outputVariable, std::to_string(cmSystemTools::FileLength(filename)));

  return true;
}